

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmop(fitsfile *gfptr,long member,fitsfile **mfptr,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *local_1a28;
  char *tmpPtr [1];
  char local_1a18 [7];
  char nstr [1];
  char card [81];
  char local_19b8 [8];
  char cwd [1025];
  char local_15a8 [8];
  char mbrLocation3 [1025];
  char local_1198 [8];
  char mbrLocation2 [1025];
  char local_d88 [8];
  char mbrLocation1 [1025];
  char local_978 [8];
  char grpLocation2 [1025];
  char local_568 [8];
  char grpLocation1 [1025];
  char local_158 [8];
  char uri [71];
  char local_108 [8];
  char extname [71];
  char local_b8 [8];
  char xtension [71];
  long local_68;
  long extver;
  long hdupos;
  int local_50;
  int dummy;
  int hdutype;
  int grptype;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  int *status_local;
  fitsfile **mfptr_local;
  long member_local;
  fitsfile *gfptr_local;
  
  extver = 0;
  local_68 = 0;
  _extnameCol = status;
  status_local = (int *)mfptr;
  mfptr_local = (fitsfile **)member;
  member_local = (long)gfptr;
  memset((void *)((long)tmpPtr + 7),0,1);
  if (*_extnameCol != 0) {
    return *_extnameCol;
  }
  iVar1 = ffgtgc((fitsfile *)member_local,&extverCol,&positionCol,&locationCol,&uriCol,&grptype,
                 &hdutype,&dummy,_extnameCol);
  *_extnameCol = iVar1;
  if (*_extnameCol != 0) goto LAB_00211b0f;
  iVar1 = ffvcfm((fitsfile *)member_local,extverCol,positionCol,locationCol,uriCol,grptype,hdutype,
                 _extnameCol);
  *_extnameCol = iVar1;
  if (*_extnameCol != 0) goto LAB_00211b0f;
  local_1a28 = local_b8;
  if (extverCol != 0) {
    iVar1 = ffgcvs((fitsfile *)member_local,extverCol,(LONGLONG)mfptr_local,1,1,
                   (char *)((long)tmpPtr + 7),&local_1a28,(int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
    iVar1 = fits_strcasecmp(local_b8,"PRIMARY");
    if (iVar1 == 0) {
      local_50 = 0;
    }
    else {
      iVar1 = fits_strcasecmp(local_b8,"IMAGE");
      if (iVar1 == 0) {
        local_50 = 0;
      }
      else {
        iVar1 = fits_strcasecmp(local_b8,"TABLE");
        if (iVar1 == 0) {
          local_50 = 1;
        }
        else {
          iVar1 = fits_strcasecmp(local_b8,"BINTABLE");
          if (iVar1 == 0) {
            local_50 = 2;
          }
          else {
            local_50 = -1;
          }
        }
      }
    }
  }
  local_1a28 = local_108;
  if (positionCol != 0) {
    iVar1 = ffgcvs((fitsfile *)member_local,positionCol,(LONGLONG)mfptr_local,1,1,
                   (char *)((long)tmpPtr + 7),&local_1a28,(int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
  }
  if (locationCol != 0) {
    iVar1 = ffgcvj((fitsfile *)member_local,locationCol,(LONGLONG)mfptr_local,1,1,0,&local_68,
                   (int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
  }
  if (uriCol != 0) {
    iVar1 = ffgcvj((fitsfile *)member_local,uriCol,(LONGLONG)mfptr_local,1,1,0,&extver,
                   (int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
  }
  local_1a28 = local_d88;
  if (grptype != 0) {
    iVar1 = ffgcvs((fitsfile *)member_local,grptype,(LONGLONG)mfptr_local,1,1,
                   (char *)((long)tmpPtr + 7),&local_1a28,(int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
  }
  local_1a28 = local_158;
  if (hdutype != 0) {
    iVar1 = ffgcvs((fitsfile *)member_local,hdutype,(LONGLONG)mfptr_local,1,1,
                   (char *)((long)tmpPtr + 7),&local_1a28,(int *)((long)&hdupos + 4),_extnameCol);
    *_extnameCol = iVar1;
  }
  if (*_extnameCol != 0) goto LAB_00211b0f;
  if (dummy == 0) {
LAB_002113b9:
    sVar3 = strlen(local_d88);
    if (sVar3 == 0) {
      iVar1 = ffreopen((fitsfile *)member_local,(fitsfile **)status_local,_extnameCol);
      *_extnameCol = iVar1;
    }
    else {
      iVar1 = fits_strcasecmp(local_158,"URL");
      if (iVar1 != 0) {
        *_extnameCol = 0x68;
        snprintf(local_1a18,0x51,"Cannot open member HDU file with URI type %s (ffgmop)",local_158);
        ffpmsg(local_1a18);
        goto LAB_00211b0f;
      }
      iVar1 = fits_is_url_absolute(local_d88);
      if (iVar1 == 0) {
        ffpmsg("Member URL is of type FILE (ffgmop)");
        if (local_d88[0] == '/') {
          ffpmsg("Member URL specifies abs file path (ffgmop)");
          iVar1 = fits_url2path(local_d88,local_1198,_extnameCol);
          *_extnameCol = iVar1;
          ffpmsg("Try to open member URL in R/W mode (ffgmop)");
          iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,1,_extnameCol);
          *_extnameCol = iVar1;
          if (*_extnameCol != 0) {
            *_extnameCol = 0;
            ffpmsg("OK, now try to open read-only (ffgmop)");
            iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,0,_extnameCol);
            *_extnameCol = iVar1;
          }
        }
        else {
          ffpmsg("Try to open member file as relative URL (ffgmop)");
          iVar1 = fits_get_url((fitsfile *)member_local,local_568,local_978,(char *)0x0,(char *)0x0,
                               (int *)0x0,_extnameCol);
          *_extnameCol = iVar1;
          if (local_568[0] == '\0') {
LAB_0021179b:
            if (local_978[0] == '\0') {
LAB_0021195f:
              ffpmsg("Cannot open member HDU FITS file (ffgmop)");
              *_extnameCol = 0x156;
            }
            else {
              iVar1 = fits_is_url_absolute(local_978);
              if ((iVar1 == 0) && (local_978[0] != '/')) {
                fits_get_cwd(local_19b8,_extnameCol);
                sVar3 = strlen(local_19b8);
                sVar2 = strlen(local_978);
                if (0x400 < sVar3 + sVar2 + 1) {
                  ffpmsg("cwd and group location2 is too long (ffgmop)");
                  *_extnameCol = 0x7d;
                  goto LAB_0021197b;
                }
                strcat(local_19b8,"/");
                strcat(local_19b8,local_978);
                strcpy(local_978,local_19b8);
              }
              iVar1 = fits_relurl2url(local_978,local_d88,local_1198,_extnameCol);
              *_extnameCol = iVar1;
              if (*_extnameCol == 0) {
                iVar1 = fits_is_url_absolute(local_1198);
                if (iVar1 == 0) {
                  iVar1 = fits_url2path(local_1198,local_15a8,_extnameCol);
                  *_extnameCol = iVar1;
                  strcpy(local_1198,local_15a8);
                }
                iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,1,_extnameCol);
                *_extnameCol = iVar1;
                if (*_extnameCol != 0) {
                  *_extnameCol = 0;
                  ffpmsg("now try to open file as READONLY (ffgmop)");
                  iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,0,_extnameCol);
                  *_extnameCol = iVar1;
                  if (*_extnameCol != 0) {
                    *_extnameCol = 0;
                    goto LAB_0021195f;
                  }
                }
              }
            }
          }
          else {
            iVar1 = fits_is_url_absolute(local_568);
            if ((iVar1 == 0) && (local_568[0] != '/')) {
              fits_get_cwd(local_19b8,_extnameCol);
              strcat(local_19b8,"/");
              sVar3 = strlen(local_19b8);
              sVar2 = strlen(local_568);
              if (0x400 < sVar3 + sVar2 + 1) {
                ffpmsg("cwd and group location1 is too long (ffgmop)");
                *_extnameCol = 0x7d;
                goto LAB_0021197b;
              }
              strcat(local_19b8,local_568);
              strcpy(local_568,local_19b8);
            }
            iVar1 = fits_relurl2url(local_568,local_d88,local_1198,_extnameCol);
            *_extnameCol = iVar1;
            if (*_extnameCol == 0) {
              iVar1 = fits_is_url_absolute(local_1198);
              if (iVar1 == 0) {
                iVar1 = fits_url2path(local_1198,local_15a8,_extnameCol);
                *_extnameCol = iVar1;
                strcpy(local_1198,local_15a8);
              }
              iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,1,_extnameCol);
              *_extnameCol = iVar1;
              if (*_extnameCol != 0) {
                *_extnameCol = 0;
                ffpmsg("now try to open file as READONLY (ffgmop)");
                iVar1 = ffopentest(10,(fitsfile **)status_local,local_1198,0,_extnameCol);
                *_extnameCol = iVar1;
                if (*_extnameCol != 0) {
                  *_extnameCol = 0;
                  goto LAB_0021179b;
                }
              }
            }
          }
        }
      }
      else {
        ffpmsg("member URL is absolute, try open R/W (ffgmop)");
        iVar1 = ffopentest(10,(fitsfile **)status_local,local_d88,1,_extnameCol);
        *_extnameCol = iVar1;
        if (*_extnameCol != 0) {
          *_extnameCol = 0;
          ffpmsg("OK, now try to open read-only (ffgmop)");
          iVar1 = ffopentest(10,(fitsfile **)status_local,local_d88,0,_extnameCol);
          *_extnameCol = iVar1;
        }
      }
    }
  }
  else if (dummy - 1U < 3) {
    iVar1 = ffreopen((fitsfile *)member_local,(fitsfile **)status_local,_extnameCol);
    *_extnameCol = iVar1;
  }
  else if (dummy - 0xbU < 2) goto LAB_002113b9;
LAB_0021197b:
  if (*_extnameCol != 0) goto LAB_00211b0f;
  if (dummy == 0) {
LAB_00211a5b:
    sVar3 = strlen(local_b8);
    if (((sVar3 == 0) || (sVar3 = strlen(local_108), sVar3 == 0)) || (local_68 < 1)) {
      iVar1 = ffmahd(*(fitsfile **)status_local,(int)extver,&local_50,_extnameCol);
      *_extnameCol = iVar1;
      if (*_extnameCol == 0x6b) {
        *_extnameCol = 0x156;
      }
    }
    else {
      iVar1 = ffmnhd(*(fitsfile **)status_local,local_50,local_108,(int)local_68,_extnameCol);
      *_extnameCol = iVar1;
      if (*_extnameCol == 0x12d) {
        *_extnameCol = 0x156;
        ffpmsg("Cannot find specified member HDU (ffgmop)");
      }
    }
  }
  else {
    if (dummy == 1) {
LAB_00211a0c:
      iVar1 = ffmnhd(*(fitsfile **)status_local,local_50,local_108,(int)local_68,_extnameCol);
      *_extnameCol = iVar1;
      if (*_extnameCol == 0x12d) {
        *_extnameCol = 0x156;
        ffpmsg("Cannot find specified member HDU (ffgmop)");
      }
      goto LAB_00211b0f;
    }
    if (dummy != 2) {
      if (dummy == 3) goto LAB_00211a5b;
      if (dummy == 0xb) goto LAB_00211a0c;
      if (dummy != 0xc) goto LAB_00211b0f;
    }
    iVar1 = ffmahd(*(fitsfile **)status_local,(int)extver,&local_50,_extnameCol);
    *_extnameCol = iVar1;
  }
LAB_00211b0f:
  if ((*_extnameCol != 0) && (*(long *)status_local != 0)) {
    ffclos(*(fitsfile **)status_local,_extnameCol);
  }
  return *_extnameCol;
}

Assistant:

int ffgmop(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   long      member, /* member ID (row num) within grouping table    */
	   fitsfile **mfptr, /* FITS file pointer to member HDU              */
	   int      *status) /* return status code                           */

/*
  open a grouping table member, returning a pointer to the member's FITS file
  with the CHDU set to the member HDU. The grouping table must be the CHDU of
  the FITS file pointed to by gfptr. The member to open is identified by its
  row number within the grouping table (first row/member == 1).

  If the member resides in a FITS file different from the grouping
  table the member file is first opened readwrite and if this fails then
  it is opened readonly. For access type of FILE:// the member file is
  searched for assuming (1) an absolute path is given, (2) a path relative
  to the CWD is given, and (3) a path relative to the grouping table file
  but not relative to the CWD is given. If all of these fail then the
  error FILE_NOT_FOUND is returned.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int grptype,hdutype;
  int dummy;

  long hdupos = 0;
  long extver = 0;

  char  xtension[FLEN_VALUE];
  char  extname[FLEN_VALUE];
  char  uri[FLEN_VALUE];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];
  char  card[FLEN_CARD];
  char  nstr[] = {'\0'};
  char *tmpPtr[1];


  if(*status != 0) return(*status);

  do
    {
      /*
	retrieve the Grouping Convention reserved column positions within
	the grouping table
      */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;
      
      /* verify the column formats */
      
      *status = ffvcfm(gfptr,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,status);

      if(*status != 0) continue;
      
      /*
	 extract the member information from grouping table
      */

      tmpPtr[0] = xtension;

      if(xtensionCol != 0)
	{

	  *status = fits_read_col_str(gfptr,xtensionCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

	  /* convert the xtension string to a hdutype code */

	  if(fits_strcasecmp(xtension,"PRIMARY")       == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"IMAGE")    == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"TABLE")    == 0) hdutype = ASCII_TBL; 
	  else if(fits_strcasecmp(xtension,"BINTABLE") == 0) hdutype = BINARY_TBL; 
	  else hdutype = ANY_HDU; 
	}

      tmpPtr[0] = extname;

      if(extnameCol  != 0)
	  *status = fits_read_col_str(gfptr,extnameCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

      if(extverCol   != 0)
	  *status = fits_read_col_lng(gfptr,extverCol,member,1,1,0,
				      (long*)&extver,&dummy,status);

      if(positionCol != 0)
	  *status = fits_read_col_lng(gfptr,positionCol,member,1,1,0,
				      (long*)&hdupos,&dummy,status);

      tmpPtr[0] = mbrLocation1;

      if(locationCol != 0)
	*status = fits_read_col_str(gfptr,locationCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);
      tmpPtr[0] = uri;

      if(uriCol != 0)
	*status = fits_read_col_str(gfptr,uriCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);

      if(*status != 0) continue;

      /* 
	 decide what FITS file the member HDU resides in and open the file
	 using the fitsfile* pointer mfptr; note that this logic is rather
	 complicated and is based primiarly upon if a URL specifier is given
	 for the member file in the grouping table
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_REF:
	case GT_ID_ALL:

	  /*
	     no location information is given so we must assume that the
	     member HDU resides in the same FITS file as the grouping table;
	     if the grouping table was incorrectly constructed then this
	     assumption will be false, but there is nothing to be done about
	     it at this point
	  */

	  *status = fits_reopen_file(gfptr,mfptr,status);
	  
	  break;

	case GT_ID_REF_URI:
	case GT_ID_POS_URI:
	case GT_ID_ALL_URI:

	  /*
	    The member location column exists. Determine if the member 
	    resides in the same file as the grouping table or in a
	    separate file; open the member file in either case
	  */

	  if(strlen(mbrLocation1) == 0)
	    {
	      /*
		 since no location information was given we must assume
		 that the member is in the same FITS file as the grouping
		 table
	      */

	      *status = fits_reopen_file(gfptr,mfptr,status);
	    }
	  else
	    {
	      /*
		make sure the location specifiation is "URL"; we cannot
		decode any other URI types at this time
	      */

	      if(fits_strcasecmp(uri,"URL") != 0)
		{
		  *status = FILE_NOT_OPENED;
		  snprintf(card,FLEN_CARD,
		  "Cannot open member HDU file with URI type %s (ffgmop)",
			  uri);
		  ffpmsg(card);

		  continue;
		}

	      /*
		The location string for the member is not NULL, so it 
		does not necessially reside in the same FITS file as the
		grouping table. 

		Three cases are attempted for opening the member's file
		in the following order:

		1. The URL given for the member's file is absolute (i.e.,
		access method supplied); try to open the member

		2. The URL given for the member's file is not absolute but
		is an absolute file path; try to open the member as a file
		after the file path is converted to a host-dependent form

		3. The URL given for the member's file is not absolute
	        and is given as a relative path to the location of the 
		grouping table's file. Create an absolute URL using the 
		grouping table's file URL and try to open the member.
		
		If all three cases fail then an error is returned. In each
		case the file is first opened in read/write mode and failing
		that readonly mode.
		
		The following DO loop is only used as a mechanism to break
		(continue) when the proper file opening method is found
	       */

	      do
		{
		  /*
		     CASE 1:

		     See if the member URL is absolute (i.e., includes a
		     access directive) and if so open the file
		   */

		  if(fits_is_url_absolute(mbrLocation1))
		    {
		      /*
			 the URL must specify an access method, which 
			 implies that its an absolute reference
			 
			 regardless of the access method, pass the whole
			 URL to the open function for processing
		       */
		      
		      ffpmsg("member URL is absolute, try open R/W (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using full URL specs in 
			 readonly mode 
		      */ 

		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READONLY,
					       status);

		      /* break from DO loop regardless of status */

		      continue;
		    }

		  /*
		     CASE 2:

		     If we got this far then the member URL location 
		     has no access type ==> FILE:// Try to open the member 
		     file using the URL as is, i.e., assume that it is given 
		     as absolute, if it starts with a '/' character
		   */

		  ffpmsg("Member URL is of type FILE (ffgmop)");

		  if(*mbrLocation1 == '/')
		    {
		      ffpmsg("Member URL specifies abs file path (ffgmop)");

		      /* 
			 convert the URL path to a host dependent path
		      */

		      *status = fits_url2path(mbrLocation1,mbrLocation2,
					      status);

		      ffpmsg("Try to open member URL in R/W mode (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using the URL as an absolute 
			 path in readonly mode 
		      */
 
		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      /* break from the Do loop regardless of the status */

		      continue;
		    }
		  
		  /* 
		     CASE 3:

		     If we got this far then the URL does not specify an
		     absoulte file path or URL with access method. Since 
		     the path to the group table's file is (obviously) valid 
		     for the CWD, create a full location string for the
		     member HDU using the grouping table URL as a basis

		     The only problem is that the grouping table file might
		     have two URLs, the original one used to open it and
		     the one that points to the real file being accessed
		     (i.e., a file accessed via HTTP but transferred to a
		     local disk file). Have to attempt to build a URL to
		     the member HDU file using both of these URLs if
		     defined.
		  */

		  ffpmsg("Try to open member file as relative URL (ffgmop)");

		  /* get the URL information for the grouping table file */

		  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,
					 NULL,NULL,NULL,status);

		  /* 
		     if the "real" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation1)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation1) &&
			                              *grpLocation1 != '/')
			{
			  fits_get_cwd(cwd,status);
			  strcat(cwd,"/");
                          if (strlen(cwd)+strlen(grpLocation1)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location1 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,grpLocation1);
			  strcpy(grpLocation1,cwd);
			}

		      /* create a full URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation1,mbrLocation1,
						mbrLocation2,status);

		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /* 
		     if we got this far then either the "real" grouping table
		     file URL was not defined or all attempts to open the
		     resulting member HDU file URL failed.

		     if the "original" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation2)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation2) &&
			                              *grpLocation2 != '/')
			{
			  fits_get_cwd(cwd,status);
                          if (strlen(cwd)+strlen(grpLocation2)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location2 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,"/");
			  strcat(cwd,grpLocation2);
			  strcpy(grpLocation2,cwd);
			}

		      /* create an absolute URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation2,mbrLocation1,
						mbrLocation2,status);
		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /*
		     if we got this far then the member HDU file could not
		     be opened using any method. Log the error.
		  */

		  ffpmsg("Cannot open member HDU FITS file (ffgmop)");
		  *status = MEMBER_NOT_FOUND;
		  
		}while(0);
	    }

	  break;

	default:

	  /* no default action */
	  
	  break;
	}
	  
      if(*status != 0) continue;

      /*
	 attempt to locate the member HDU within its FITS file as determined
	 and opened above
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_POS_URI:

	  /*
	    try to find the member hdu in the the FITS file pointed to
	    by mfptr based upon its HDU posistion value. Note that is 
	    impossible to verify if the HDU is actually the correct HDU due 
	    to a lack of information.
	  */
	  
	  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,status);

	  break;

	case GT_ID_REF:
	case GT_ID_REF_URI:

	  /*
	     try to find the member hdu in the FITS file pointed to
	     by mfptr based upon its XTENSION, EXTNAME and EXTVER keyword 
	     values
	  */

	  *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	  if(*status == BAD_HDU_NUM) 
	    {
	      *status = MEMBER_NOT_FOUND;
	      ffpmsg("Cannot find specified member HDU (ffgmop)");
	    }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	case GT_ID_ALL:
	case GT_ID_ALL_URI:

	  /*
	     if the member entry has reference information then use it
             (ID by reference is safer than ID by position) else use
	     the position information
	  */

	  if(strlen(xtension) > 0 && strlen(extname) > 0 && extver > 0)
	    {
	      /* valid reference info exists so use it */
	      
	      /* try to find the member hdu in the grouping table's file */

	      *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	      if(*status == BAD_HDU_NUM) 
		{
		  *status = MEMBER_NOT_FOUND;
		  ffpmsg("Cannot find specified member HDU (ffgmop)");
		}
	    }
	  else
	      {
		  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,
					    status);
		  if(*status == END_OF_FILE) *status = MEMBER_NOT_FOUND;
	      }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	default:

	  /* no default action */

	  break;
	}
      
    }while(0);

  if(*status != 0 && *mfptr != NULL) 
    {
      fits_close_file(*mfptr,status);
    }

  return(*status);
}